

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  int iVar3;
  Layer *__arg;
  int *piVar4;
  long *plVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  void *pvVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  uint uVar19;
  pointer piVar20;
  int iVar21;
  uint uVar22;
  pointer pMVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  pointer pMVar27;
  bool bVar28;
  Mat bottom_blob_bf16_1;
  Mat m;
  Mat local_e8;
  uint local_9c;
  Mat local_98;
  Option *local_50;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_48;
  allocator_type local_39;
  Net *local_38;
  
  __arg = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
          super__Vector_impl_data._M_start[layer_index];
  local_48 = blob_mats;
  local_38 = this;
  if (__arg->one_blob_only == true) {
    iVar3 = *(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar21 = *(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start[iVar3].dims == 0) {
      uVar26 = forward_layer(this,(this->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar3].producer,blob_mats
                             ,opt);
      if (uVar26 != 0) {
        bVar28 = false;
        goto joined_r0x001264ea;
      }
      local_50 = (Option *)((ulong)local_50 & 0xffffffff00000000);
    }
    pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.data = pMVar23[iVar3].data;
    piVar4 = pMVar23[iVar3].refcount;
    local_e8.refcount._0_4_ = SUB84(piVar4,0);
    local_e8.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
    local_e8.elemsize._0_4_ = (undefined4)pMVar23[iVar3].elemsize;
    local_e8.elemsize._4_4_ = (undefined4)(pMVar23[iVar3].elemsize >> 0x20);
    local_e8.elempack = pMVar23[iVar3].elempack;
    local_e8.allocator = pMVar23[iVar3].allocator;
    pMVar27 = pMVar23 + iVar3;
    local_e8.dims = pMVar27->dims;
    local_e8.w = pMVar27->w;
    local_e8._48_8_ = *(undefined8 *)(&pMVar27->dims + 2);
    local_e8.cstep = pMVar23[iVar3].cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    if (opt->lightmode == true) {
      pMVar27 = (local_48->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar23 = pMVar27 + iVar3;
      piVar4 = pMVar27[iVar3].refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pMVar23->allocator == (Allocator *)0x0) {
            if (pMVar23->data != (void *)0x0) {
              free(pMVar23->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar23->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
      pMVar23->data = (void *)0x0;
      pMVar23->refcount = (int *)0x0;
      pMVar23->dims = 0;
      pMVar23->w = 0;
      pMVar23->h = 0;
      pMVar23->c = 0;
      pMVar23->cstep = 0;
      if ((__arg->support_inplace == true) &&
         (*(int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_) != 1)) {
        if ((local_e8.data == (void *)0x0) || (local_e8.cstep * (long)local_e8.c == 0)) {
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.c = 0;
          local_98.cstep = 0;
        }
        else {
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.c = 0;
          local_98.cstep = 0;
          if (local_e8.dims == 3) {
            Mat::create(&local_98,local_e8.w,local_e8.h,local_e8.c,
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize),
                        local_e8.elempack,(Allocator *)0x0);
          }
          else if (local_e8.dims == 2) {
            Mat::create(&local_98,local_e8.w,local_e8.h,
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize),
                        local_e8.elempack,(Allocator *)0x0);
          }
          else if (local_e8.dims == 1) {
            Mat::create(&local_98,local_e8.w,
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize),
                        local_e8.elempack,(Allocator *)0x0);
          }
          if ((long)local_e8.c * local_e8.cstep != 0) {
            memcpy(local_98.data,local_e8.data,
                   (long)local_e8.c * local_e8.cstep *
                   CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
          }
        }
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_e8.allocator + 0x18))();
            }
          }
        }
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        local_e8.data = local_98.data;
        local_e8.refcount._0_4_ = local_98.refcount._0_4_;
        local_e8.refcount._4_4_ = local_98.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_98.elemsize;
        local_e8.elemsize._4_4_ = local_98.elemsize._4_4_;
        local_e8.elempack = local_98.elempack;
        local_e8.allocator = local_98.allocator;
        uVar9._0_4_ = local_98.dims;
        uVar9._4_4_ = local_98.w;
        local_e8.dims = local_98.dims;
        local_e8.w = local_98.w;
        uVar10._0_4_ = local_98.h;
        uVar10._4_4_ = local_98.c;
        local_e8.h = local_98.h;
        local_e8.c = local_98.c;
        local_e8.cstep = local_98.cstep;
        uVar17 = uVar9;
        uVar18 = uVar10;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          uVar17 = local_e8._40_8_;
          uVar18 = local_e8._48_8_;
          if (*piVar4 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                local_e8._40_8_ = uVar9;
                local_e8._48_8_ = uVar10;
                free(local_98.data);
                uVar17 = local_e8._40_8_;
                uVar18 = local_e8._48_8_;
              }
            }
            else {
              local_e8._40_8_ = uVar9;
              local_e8._48_8_ = uVar10;
              (**(code **)(*(long *)local_98.allocator + 0x18))();
              uVar17 = local_e8._40_8_;
              uVar18 = local_e8._48_8_;
            }
          }
        }
        local_e8._48_8_ = uVar18;
        local_e8._40_8_ = uVar17;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
      }
    }
    if (opt->use_bf16_storage == true) {
      if ((CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) /
           (ulong)(long)local_e8.elempack == 4) && (__arg->support_bf16_storage == true)) {
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
        cast_float32_to_bfloat16(&local_e8,&local_98,opt);
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_e8.allocator + 0x18))();
            }
          }
        }
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        local_e8.data = local_98.data;
        local_e8.refcount._0_4_ = local_98.refcount._0_4_;
        local_e8.refcount._4_4_ = local_98.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_98.elemsize;
        local_e8.elemsize._4_4_ = local_98.elemsize._4_4_;
        local_e8.elempack = local_98.elempack;
        local_e8.allocator = local_98.allocator;
        uVar17._0_4_ = local_98.dims;
        uVar17._4_4_ = local_98.w;
        local_e8.dims = local_98.dims;
        local_e8.w = local_98.w;
        uVar18._0_4_ = local_98.h;
        uVar18._4_4_ = local_98.c;
        local_e8.h = local_98.h;
        local_e8.c = local_98.c;
        local_e8.cstep = local_98.cstep;
        uVar9 = uVar17;
        uVar10 = uVar18;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          uVar9 = local_e8._40_8_;
          uVar10 = local_e8._48_8_;
          if (*piVar4 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                local_e8._40_8_ = uVar17;
                local_e8._48_8_ = uVar18;
                free(local_98.data);
                uVar9 = local_e8._40_8_;
                uVar10 = local_e8._48_8_;
              }
            }
            else {
              local_e8._40_8_ = uVar17;
              local_e8._48_8_ = uVar18;
              (**(code **)(*(long *)local_98.allocator + 0x18))();
              uVar9 = local_e8._40_8_;
              uVar10 = local_e8._48_8_;
            }
          }
        }
        local_e8._48_8_ = uVar10;
        local_e8._40_8_ = uVar9;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
      }
      if ((CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) /
           (ulong)(long)local_e8.elempack == 2) && (__arg->support_bf16_storage == false)) {
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
        cast_bfloat16_to_float32(&local_e8,&local_98,opt);
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_e8.allocator + 0x18))();
            }
          }
        }
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        local_e8.data = local_98.data;
        local_e8.refcount._0_4_ = local_98.refcount._0_4_;
        local_e8.refcount._4_4_ = local_98.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_98.elemsize;
        local_e8.elemsize._4_4_ = local_98.elemsize._4_4_;
        local_e8.elempack = local_98.elempack;
        local_e8.allocator = local_98.allocator;
        uVar12._0_4_ = local_98.dims;
        uVar12._4_4_ = local_98.w;
        local_e8.dims = local_98.dims;
        local_e8.w = local_98.w;
        uVar13._0_4_ = local_98.h;
        uVar13._4_4_ = local_98.c;
        local_e8.h = local_98.h;
        local_e8.c = local_98.c;
        local_e8.cstep = local_98.cstep;
        uVar9 = uVar12;
        uVar10 = uVar13;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          uVar9 = local_e8._40_8_;
          uVar10 = local_e8._48_8_;
          if (*piVar4 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                local_e8._40_8_ = uVar12;
                local_e8._48_8_ = uVar13;
                free(local_98.data);
                uVar9 = local_e8._40_8_;
                uVar10 = local_e8._48_8_;
              }
            }
            else {
              local_e8._40_8_ = uVar12;
              local_e8._48_8_ = uVar13;
              (**(code **)(*(long *)local_98.allocator + 0x18))();
              uVar9 = local_e8._40_8_;
              uVar10 = local_e8._48_8_;
            }
          }
        }
        local_e8._48_8_ = uVar10;
        local_e8._40_8_ = uVar9;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
      }
    }
    if (opt->use_packing_layout == true) {
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.c = 0;
      local_98.cstep = 0;
      convert_packing(&local_e8,&local_98,
                      (uint)__arg->support_packing + (uint)__arg->support_packing * 2 + 1,opt);
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (**(code **)(*(long *)local_e8.allocator + 0x18))();
          }
        }
      }
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      local_e8.data = local_98.data;
      local_e8.refcount._0_4_ = local_98.refcount._0_4_;
      local_e8.refcount._4_4_ = local_98.refcount._4_4_;
      local_e8.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_e8.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_e8.elempack = local_98.elempack;
      local_e8.allocator = local_98.allocator;
      uVar14._0_4_ = local_98.dims;
      uVar14._4_4_ = local_98.w;
      local_e8.dims = local_98.dims;
      local_e8.w = local_98.w;
      uVar15._0_4_ = local_98.h;
      uVar15._4_4_ = local_98.c;
      local_e8.h = local_98.h;
      local_e8.c = local_98.c;
      local_e8.cstep = local_98.cstep;
      uVar9 = uVar14;
      uVar10 = uVar15;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        uVar9 = local_e8._40_8_;
        uVar10 = local_e8._48_8_;
        if (*piVar4 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              local_e8._40_8_ = uVar14;
              local_e8._48_8_ = uVar15;
              free(local_98.data);
              uVar9 = local_e8._40_8_;
              uVar10 = local_e8._48_8_;
            }
          }
          else {
            local_e8._40_8_ = uVar14;
            local_e8._48_8_ = uVar15;
            (**(code **)(*(long *)local_98.allocator + 0x18))();
            uVar9 = local_e8._40_8_;
            uVar10 = local_e8._48_8_;
          }
        }
      }
      local_e8._48_8_ = uVar10;
      local_e8._40_8_ = uVar9;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.c = 0;
      local_98.cstep = 0;
    }
    if ((opt->lightmode == true) && (__arg->support_inplace == true)) {
      uVar19 = (*__arg->_vptr_Layer[9])(__arg,&local_e8,opt);
      uVar26 = uVar19;
      if ((uVar19 == 0) &&
         (pMVar23 = (local_48->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + iVar21, uVar26 = (uint)local_50,
         pMVar23 != &local_e8)) {
        piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar23->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (pMVar23->allocator == (Allocator *)0x0) {
              if (pMVar23->data != (void *)0x0) {
                free(pMVar23->data);
                uVar26 = (uint)local_50;
              }
            }
            else {
              (**(code **)(*(long *)pMVar23->allocator + 0x18))();
              uVar26 = (uint)local_50;
            }
          }
        }
        *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
        pMVar23->data = (void *)0x0;
        pMVar23->refcount = (int *)0x0;
        pMVar23->dims = 0;
        pMVar23->w = 0;
        pMVar23->h = 0;
        pMVar23->c = 0;
        pMVar23->cstep = 0;
        pMVar23->data = local_e8.data;
        pMVar23->refcount = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        pMVar23->elemsize = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
        pMVar23->elempack = local_e8.elempack;
        pMVar23->allocator = local_e8.allocator;
        pMVar23->dims = local_e8.dims;
        pMVar23->w = local_e8.w;
        pMVar23->h = local_e8.h;
        pMVar23->c = local_e8.c;
        pMVar23->cstep = local_e8.cstep;
      }
    }
    else {
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.c = 0;
      local_98.cstep = 0;
      uVar19 = (*__arg->_vptr_Layer[7])(__arg,&local_e8,&local_98,opt);
      uVar22 = (uint)local_50;
      uVar26 = uVar19;
      if ((uVar19 == 0) &&
         (pMVar23 = (local_48->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + iVar21, uVar26 = uVar22, pMVar23 != &local_98
         )) {
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar23->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (pMVar23->allocator == (Allocator *)0x0) {
              if (pMVar23->data != (void *)0x0) {
                free(pMVar23->data);
                uVar26 = (uint)local_50;
              }
            }
            else {
              (**(code **)(*(long *)pMVar23->allocator + 0x18))();
              uVar26 = (uint)local_50;
            }
          }
        }
        *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
        pMVar23->data = (void *)0x0;
        pMVar23->refcount = (int *)0x0;
        pMVar23->dims = 0;
        pMVar23->w = 0;
        pMVar23->h = 0;
        pMVar23->c = 0;
        pMVar23->cstep = 0;
        pMVar23->data = local_98.data;
        pMVar23->refcount = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        pMVar23->elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
        pMVar23->elempack = local_98.elempack;
        pMVar23->allocator = local_98.allocator;
        pMVar23->dims = local_98.dims;
        pMVar23->w = local_98.w;
        pMVar23->h = local_98.h;
        pMVar23->c = local_98.c;
        pMVar23->cstep = local_98.cstep;
      }
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (**(code **)(*(long *)local_98.allocator + 0x18))();
          }
        }
      }
    }
    bVar28 = uVar19 == 0;
    piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_e8.allocator == (Allocator *)0x0) {
          if (local_e8.data != (void *)0x0) {
            free(local_e8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_e8.allocator + 0x18))();
        }
      }
    }
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98,
               (long)(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2,(allocator_type *)&local_e8);
    piVar20 = (__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar28 = (__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish != piVar20;
    if (bVar28) {
      lVar25 = 0;
      uVar24 = 0;
      local_50 = opt;
      do {
        iVar3 = piVar20[uVar24];
        pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (pMVar23[iVar3].dims == 0) {
          uVar26 = forward_layer(local_38,(local_38->blobs).
                                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                          ._M_impl.super__Vector_impl_data._M_start[iVar3].producer,
                                 blob_mats,opt);
          if (uVar26 != 0) {
            local_9c = uVar26;
          }
          pMVar23 = (pointer)(ulong)local_9c;
          if (uVar26 == 0) goto LAB_00125aec;
          bVar11 = false;
        }
        else {
LAB_00125aec:
          pvVar16 = local_98.data;
          iVar21 = (int)pMVar23;
          pMVar27 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + iVar3;
          pMVar23 = (pointer)((long)local_98.data + lVar25);
          if (pMVar23 != pMVar27) {
            piVar4 = pMVar27->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = *(int **)((long)local_98.data + lVar25 + 8);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                plVar5 = *(long **)((long)local_98.data + lVar25 + 0x20);
                if (plVar5 == (long *)0x0) {
                  if (*(void **)((long)local_98.data + lVar25) != (void *)0x0) {
                    free(*(void **)((long)local_98.data + lVar25));
                  }
                }
                else {
                  (**(code **)(*plVar5 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
            pMVar23->data = (void *)0x0;
            pMVar23->refcount = (int *)0x0;
            puVar2 = (undefined8 *)((long)pvVar16 + lVar25 + 0x28);
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined8 *)((long)pvVar16 + lVar25 + 0x38) = 0;
            piVar4 = pMVar27->refcount;
            *(undefined8 *)((long)pvVar16 + lVar25) = pMVar27->data;
            ((undefined8 *)((long)pvVar16 + lVar25))[1] = piVar4;
            *(size_t *)((long)pvVar16 + lVar25 + 0x10) = pMVar27->elemsize;
            *(int *)((long)pvVar16 + lVar25 + 0x18) = pMVar27->elempack;
            *(Allocator **)((long)pvVar16 + lVar25 + 0x20) = pMVar27->allocator;
            iVar6 = pMVar27->w;
            iVar7 = pMVar27->h;
            iVar8 = pMVar27->c;
            piVar4 = (int *)((long)pvVar16 + lVar25 + 0x28);
            *piVar4 = pMVar27->dims;
            piVar4[1] = iVar6;
            piVar4[2] = iVar7;
            piVar4[3] = iVar8;
            *(size_t *)((long)pvVar16 + lVar25 + 0x38) = pMVar27->cstep;
          }
          blob_mats = local_48;
          opt = local_50;
          if (local_50->lightmode == true) {
            pMVar27 = (local_48->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pMVar23 = pMVar27 + iVar3;
            piVar4 = pMVar27[iVar3].refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (pMVar23->allocator == (Allocator *)0x0) {
                  if (pMVar23->data != (void *)0x0) {
                    free(pMVar23->data);
                  }
                }
                else {
                  (**(code **)(*(long *)pMVar23->allocator + 0x18))();
                }
              }
            }
            blob_mats = local_48;
            opt = local_50;
            *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
            pMVar23->data = (void *)0x0;
            pMVar23->refcount = (int *)0x0;
            pMVar23->dims = 0;
            pMVar23->w = 0;
            pMVar23->h = 0;
            pMVar23->c = 0;
            pMVar23->cstep = 0;
            if ((__arg->support_inplace == true) &&
               (**(int **)((long)local_98.data + lVar25 + 8) != 1)) {
              Mat::clone(&local_e8,(__fn *)((long)local_98.data + lVar25),(void *)0x0,iVar21,__arg);
              pvVar16 = local_98.data;
              pMVar1 = (Mat *)((long)local_98.data + lVar25);
              if (pMVar1 != &local_e8) {
                piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
                piVar4 = *(int **)((long)local_98.data + lVar25 + 8);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    plVar5 = *(long **)((long)local_98.data + lVar25 + 0x20);
                    if (plVar5 == (long *)0x0) {
                      if (*(void **)((long)local_98.data + lVar25) != (void *)0x0) {
                        free(*(void **)((long)local_98.data + lVar25));
                      }
                    }
                    else {
                      (**(code **)(*plVar5 + 0x18))();
                    }
                  }
                }
                *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
                *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
                pMVar1->data = (void *)0x0;
                pMVar1->refcount = (int *)0x0;
                puVar2 = (undefined8 *)((long)pvVar16 + lVar25 + 0x28);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined8 *)((long)pvVar16 + lVar25 + 0x38) = 0;
                *(undefined8 *)((long)pvVar16 + lVar25) = local_e8.data;
                ((undefined8 *)((long)pvVar16 + lVar25))[1] =
                     CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
                *(ulong *)((long)pvVar16 + lVar25 + 0x10) =
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
                *(int *)((long)pvVar16 + lVar25 + 0x18) = local_e8.elempack;
                *(Allocator **)((long)pvVar16 + lVar25 + 0x20) = local_e8.allocator;
                piVar4 = (int *)((long)pvVar16 + lVar25 + 0x28);
                *piVar4 = local_e8.dims;
                piVar4[1] = local_e8.w;
                piVar4[2] = local_e8.h;
                piVar4[3] = local_e8.c;
                *(size_t *)((long)pvVar16 + lVar25 + 0x38) = local_e8.cstep;
              }
              piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_e8.allocator == (Allocator *)0x0) {
                    if (local_e8.data != (void *)0x0) {
                      free(local_e8.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_e8.allocator + 0x18))();
                  }
                }
              }
              local_e8.elemsize._0_4_ = 0;
              local_e8.elemsize._4_4_ = 0;
              local_e8.elempack = 0;
              local_e8.data = (void *)0x0;
              local_e8.refcount._0_4_ = 0;
              local_e8.refcount._4_4_ = 0;
              local_e8.dims = 0;
              local_e8.w = 0;
              local_e8.h = 0;
              local_e8.c = 0;
              local_e8.cstep = 0;
            }
          }
          if (opt->use_bf16_storage == true) {
            if ((*(ulong *)((long)local_98.data + lVar25 + 0x10) /
                 (ulong)(long)*(int *)((long)local_98.data + lVar25 + 0x18) == 4) &&
               (__arg->support_bf16_storage == true)) {
              local_e8.elemsize._0_4_ = 0;
              local_e8.elemsize._4_4_ = 0;
              local_e8.elempack = 0;
              local_e8.data = (void *)0x0;
              local_e8.refcount._0_4_ = 0;
              local_e8.refcount._4_4_ = 0;
              local_e8.h = 0;
              local_e8.c = 0;
              local_e8.cstep = 0;
              local_e8.allocator = (Allocator *)0x0;
              local_e8.dims = 0;
              local_e8.w = 0;
              cast_float32_to_bfloat16((Mat *)((long)local_98.data + lVar25),&local_e8,opt);
              pvVar16 = local_98.data;
              pMVar1 = (Mat *)((long)local_98.data + lVar25);
              if (pMVar1 != &local_e8) {
                piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
                piVar4 = *(int **)((long)local_98.data + lVar25 + 8);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    plVar5 = *(long **)((long)local_98.data + lVar25 + 0x20);
                    if (plVar5 == (long *)0x0) {
                      if (*(void **)((long)local_98.data + lVar25) != (void *)0x0) {
                        free(*(void **)((long)local_98.data + lVar25));
                      }
                    }
                    else {
                      (**(code **)(*plVar5 + 0x18))();
                    }
                  }
                }
                *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
                *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
                pMVar1->data = (void *)0x0;
                pMVar1->refcount = (int *)0x0;
                puVar2 = (undefined8 *)((long)pvVar16 + lVar25 + 0x28);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined8 *)((long)pvVar16 + lVar25 + 0x38) = 0;
                *(undefined8 *)((long)pvVar16 + lVar25) = local_e8.data;
                ((undefined8 *)((long)pvVar16 + lVar25))[1] =
                     CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
                *(ulong *)((long)pvVar16 + lVar25 + 0x10) =
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
                *(int *)((long)pvVar16 + lVar25 + 0x18) = local_e8.elempack;
                *(Allocator **)((long)pvVar16 + lVar25 + 0x20) = local_e8.allocator;
                piVar4 = (int *)((long)pvVar16 + lVar25 + 0x28);
                *piVar4 = local_e8.dims;
                piVar4[1] = local_e8.w;
                piVar4[2] = local_e8.h;
                piVar4[3] = local_e8.c;
                *(size_t *)((long)pvVar16 + lVar25 + 0x38) = local_e8.cstep;
              }
              piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_e8.allocator == (Allocator *)0x0) {
                    if (local_e8.data != (void *)0x0) {
                      free(local_e8.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_e8.allocator + 0x18))();
                  }
                }
              }
              local_e8.elemsize._0_4_ = 0;
              local_e8.elemsize._4_4_ = 0;
              local_e8.elempack = 0;
              local_e8.data = (void *)0x0;
              local_e8.refcount._0_4_ = 0;
              local_e8.refcount._4_4_ = 0;
              local_e8.dims = 0;
              local_e8.w = 0;
              local_e8.h = 0;
              local_e8.c = 0;
              local_e8.cstep = 0;
            }
            if ((*(ulong *)((long)local_98.data + lVar25 + 0x10) /
                 (ulong)(long)*(int *)((long)local_98.data + lVar25 + 0x18) == 2) &&
               (__arg->support_bf16_storage == false)) {
              local_e8.elemsize._0_4_ = 0;
              local_e8.elemsize._4_4_ = 0;
              local_e8.elempack = 0;
              local_e8.data = (void *)0x0;
              local_e8.refcount._0_4_ = 0;
              local_e8.refcount._4_4_ = 0;
              local_e8.h = 0;
              local_e8.c = 0;
              local_e8.cstep = 0;
              local_e8.allocator = (Allocator *)0x0;
              local_e8.dims = 0;
              local_e8.w = 0;
              cast_bfloat16_to_float32((Mat *)((long)local_98.data + lVar25),&local_e8,opt);
              pvVar16 = local_98.data;
              pMVar1 = (Mat *)((long)local_98.data + lVar25);
              if (pMVar1 != &local_e8) {
                piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
                piVar4 = *(int **)((long)local_98.data + lVar25 + 8);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    plVar5 = *(long **)((long)local_98.data + lVar25 + 0x20);
                    if (plVar5 == (long *)0x0) {
                      if (*(void **)((long)local_98.data + lVar25) != (void *)0x0) {
                        free(*(void **)((long)local_98.data + lVar25));
                      }
                    }
                    else {
                      (**(code **)(*plVar5 + 0x18))();
                    }
                  }
                }
                *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
                *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
                pMVar1->data = (void *)0x0;
                pMVar1->refcount = (int *)0x0;
                puVar2 = (undefined8 *)((long)pvVar16 + lVar25 + 0x28);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined8 *)((long)pvVar16 + lVar25 + 0x38) = 0;
                *(undefined8 *)((long)pvVar16 + lVar25) = local_e8.data;
                ((undefined8 *)((long)pvVar16 + lVar25))[1] =
                     CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
                *(ulong *)((long)pvVar16 + lVar25 + 0x10) =
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
                *(int *)((long)pvVar16 + lVar25 + 0x18) = local_e8.elempack;
                *(Allocator **)((long)pvVar16 + lVar25 + 0x20) = local_e8.allocator;
                piVar4 = (int *)((long)pvVar16 + lVar25 + 0x28);
                *piVar4 = local_e8.dims;
                piVar4[1] = local_e8.w;
                piVar4[2] = local_e8.h;
                piVar4[3] = local_e8.c;
                *(size_t *)((long)pvVar16 + lVar25 + 0x38) = local_e8.cstep;
              }
              piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_e8.allocator == (Allocator *)0x0) {
                    if (local_e8.data != (void *)0x0) {
                      free(local_e8.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_e8.allocator + 0x18))();
                  }
                }
              }
              local_e8.elemsize._0_4_ = 0;
              local_e8.elemsize._4_4_ = 0;
              local_e8.elempack = 0;
              local_e8.data = (void *)0x0;
              local_e8.refcount._0_4_ = 0;
              local_e8.refcount._4_4_ = 0;
              local_e8.dims = 0;
              local_e8.w = 0;
              local_e8.h = 0;
              local_e8.c = 0;
              local_e8.cstep = 0;
            }
          }
          bVar11 = true;
          if (opt->use_packing_layout == true) {
            local_e8.elemsize._0_4_ = 0;
            local_e8.elemsize._4_4_ = 0;
            local_e8.elempack = 0;
            local_e8.data = (void *)0x0;
            local_e8.refcount._0_4_ = 0;
            local_e8.refcount._4_4_ = 0;
            local_e8.h = 0;
            local_e8.c = 0;
            local_e8.cstep = 0;
            local_e8.allocator = (Allocator *)0x0;
            local_e8.dims = 0;
            local_e8.w = 0;
            convert_packing((Mat *)((long)local_98.data + lVar25),&local_e8,
                            (uint)__arg->support_packing + (uint)__arg->support_packing * 2 + 1,opt)
            ;
            pvVar16 = local_98.data;
            pMVar1 = (Mat *)((long)local_98.data + lVar25);
            if (pMVar1 != &local_e8) {
              piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = *(int **)((long)local_98.data + lVar25 + 8);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar5 = *(long **)((long)local_98.data + lVar25 + 0x20);
                  if (plVar5 == (long *)0x0) {
                    if (*(void **)((long)local_98.data + lVar25) != (void *)0x0) {
                      free(*(void **)((long)local_98.data + lVar25));
                    }
                  }
                  else {
                    (**(code **)(*plVar5 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              pMVar1->refcount = (int *)0x0;
              puVar2 = (undefined8 *)((long)pvVar16 + lVar25 + 0x28);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)pvVar16 + lVar25 + 0x38) = 0;
              *(undefined8 *)((long)pvVar16 + lVar25) = local_e8.data;
              ((undefined8 *)((long)pvVar16 + lVar25))[1] =
                   CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
              *(ulong *)((long)pvVar16 + lVar25 + 0x10) =
                   CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
              *(int *)((long)pvVar16 + lVar25 + 0x18) = local_e8.elempack;
              *(Allocator **)((long)pvVar16 + lVar25 + 0x20) = local_e8.allocator;
              piVar4 = (int *)((long)pvVar16 + lVar25 + 0x28);
              *piVar4 = local_e8.dims;
              piVar4[1] = local_e8.w;
              piVar4[2] = local_e8.h;
              piVar4[3] = local_e8.c;
              *(size_t *)((long)pvVar16 + lVar25 + 0x38) = local_e8.cstep;
            }
            opt = local_50;
            piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_e8.allocator == (Allocator *)0x0) {
                  if (local_e8.data != (void *)0x0) {
                    free(local_e8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_e8.allocator + 0x18))();
                }
              }
            }
            local_e8.elemsize._0_4_ = 0;
            local_e8.elemsize._4_4_ = 0;
            local_e8.elempack = 0;
            local_e8.data = (void *)0x0;
            local_e8.refcount._0_4_ = 0;
            local_e8.refcount._4_4_ = 0;
            local_e8.dims = 0;
            local_e8.w = 0;
            local_e8.h = 0;
            local_e8.c = 0;
            local_e8.cstep = 0;
          }
        }
        if (!bVar11) break;
        uVar24 = uVar24 + 1;
        piVar20 = (__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar25 = lVar25 + 0x40;
        bVar28 = uVar24 < (ulong)((long)(__arg->bottoms).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar20 >> 2);
      } while (bVar28);
    }
    if (bVar28) {
      bVar28 = false;
      uVar26 = local_9c;
    }
    else {
      if ((opt->lightmode == true) && (__arg->support_inplace == true)) {
        uVar19 = (*__arg->_vptr_Layer[8])(__arg,&local_98,opt);
        uVar26 = uVar19;
        if ((uVar19 == 0) &&
           (piVar20 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar26 = local_9c,
           (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar20)) {
          lVar25 = 0;
          uVar24 = 0;
          do {
            pvVar16 = local_98.data;
            pMVar23 = (local_48->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                      super__Vector_impl_data._M_start + piVar20[uVar24];
            if ((pointer)((long)local_98.data + lVar25) != pMVar23) {
              piVar4 = *(int **)((long)local_98.data + lVar25 + 8);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = pMVar23->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (pMVar23->allocator == (Allocator *)0x0) {
                    if (pMVar23->data != (void *)0x0) {
                      free(pMVar23->data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)pMVar23->allocator + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
              pMVar23->data = (void *)0x0;
              pMVar23->refcount = (int *)0x0;
              pMVar23->dims = 0;
              pMVar23->w = 0;
              pMVar23->h = 0;
              pMVar23->c = 0;
              pMVar23->cstep = 0;
              piVar4 = (int *)((undefined8 *)((long)pvVar16 + lVar25))[1];
              pMVar23->data = *(void **)((long)pvVar16 + lVar25);
              pMVar23->refcount = piVar4;
              pMVar23->elemsize = *(size_t *)((long)pvVar16 + lVar25 + 0x10);
              pMVar23->elempack = *(int *)((long)pvVar16 + lVar25 + 0x18);
              pMVar23->allocator = *(Allocator **)((long)pvVar16 + lVar25 + 0x20);
              puVar2 = (undefined8 *)((long)pvVar16 + lVar25 + 0x28);
              uVar9 = *puVar2;
              uVar10 = puVar2[1];
              pMVar23->dims = (int)uVar9;
              pMVar23->w = (int)((ulong)uVar9 >> 0x20);
              pMVar23->h = (int)uVar10;
              pMVar23->c = (int)((ulong)uVar10 >> 0x20);
              pMVar23->cstep = *(size_t *)((long)pvVar16 + lVar25 + 0x38);
            }
            uVar24 = uVar24 + 1;
            piVar20 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar25 = lVar25 + 0x40;
            uVar26 = local_9c;
          } while (uVar24 < (ulong)((long)(__arg->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar20 >> 2));
        }
      }
      else {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8,
                   (long)(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   *(long *)&(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data >> 2,&local_39);
        uVar19 = (*__arg->_vptr_Layer[6])(__arg,&local_98,&local_e8,opt);
        uVar26 = uVar19;
        if ((uVar19 == 0) &&
           (piVar20 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar26 = local_9c,
           (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar20)) {
          lVar25 = 0;
          uVar24 = 0;
          do {
            pvVar16 = local_e8.data;
            pMVar23 = (local_48->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                      super__Vector_impl_data._M_start + piVar20[uVar24];
            if ((pointer)((long)local_e8.data + lVar25) != pMVar23) {
              piVar4 = *(int **)((long)local_e8.data + lVar25 + 8);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = pMVar23->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (pMVar23->allocator == (Allocator *)0x0) {
                    if (pMVar23->data != (void *)0x0) {
                      free(pMVar23->data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)pMVar23->allocator + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
              pMVar23->data = (void *)0x0;
              pMVar23->refcount = (int *)0x0;
              pMVar23->dims = 0;
              pMVar23->w = 0;
              pMVar23->h = 0;
              pMVar23->c = 0;
              pMVar23->cstep = 0;
              piVar4 = (int *)((undefined8 *)((long)pvVar16 + lVar25))[1];
              pMVar23->data = *(void **)((long)pvVar16 + lVar25);
              pMVar23->refcount = piVar4;
              pMVar23->elemsize = *(size_t *)((long)pvVar16 + lVar25 + 0x10);
              pMVar23->elempack = *(int *)((long)pvVar16 + lVar25 + 0x18);
              pMVar23->allocator = *(Allocator **)((long)pvVar16 + lVar25 + 0x20);
              puVar2 = (undefined8 *)((long)pvVar16 + lVar25 + 0x28);
              uVar9 = *puVar2;
              uVar10 = puVar2[1];
              pMVar23->dims = (int)uVar9;
              pMVar23->w = (int)((ulong)uVar9 >> 0x20);
              pMVar23->h = (int)uVar10;
              pMVar23->c = (int)((ulong)uVar10 >> 0x20);
              pMVar23->cstep = *(size_t *)((long)pvVar16 + lVar25 + 0x38);
            }
            uVar24 = uVar24 + 1;
            piVar20 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar25 = lVar25 + 0x40;
            uVar26 = local_9c;
          } while (uVar24 < (ulong)((long)(__arg->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar20 >> 2));
        }
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8);
      }
      bVar28 = uVar19 == 0;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98);
  }
joined_r0x001264ea:
  if (bVar28) {
    uVar26 = 0;
  }
  return uVar26;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     fprintf(stderr, "forward_layer %d %s\n", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        if (opt.use_bf16_storage)
        {
            if (bottom_blob.elemsize / bottom_blob.elempack == 4u && layer->support_bf16_storage)
            {
                Mat bottom_blob_bf16;
                cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
                bottom_blob = bottom_blob_bf16;
            }
            if (bottom_blob.elemsize / bottom_blob.elempack == 2u && !layer->support_bf16_storage)
            {
                Mat bottom_blob_fp32;
                cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
                bottom_blob = bottom_blob_fp32;
            }
        }

        if (opt.use_packing_layout)
        {
            int elempack = layer->support_packing ? 4 : 1;

            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, elempack, opt);
            bottom_blob = bottom_blob_packed;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }

            if (opt.use_bf16_storage)
            {
                if (bottom_blobs[i].elemsize / bottom_blobs[i].elempack == 4u && layer->support_bf16_storage)
                {
                    Mat bottom_blob_bf16;
                    cast_float32_to_bfloat16(bottom_blobs[i], bottom_blob_bf16, opt);
                    bottom_blobs[i] = bottom_blob_bf16;
                }
                if (bottom_blobs[i].elemsize / bottom_blobs[i].elempack == 2u && !layer->support_bf16_storage)
                {
                    Mat bottom_blob_fp32;
                    cast_bfloat16_to_float32(bottom_blobs[i], bottom_blob_fp32, opt);
                    bottom_blobs[i] = bottom_blob_fp32;
                }
            }

            if (opt.use_packing_layout)
            {
                int elempack = layer->support_packing ? 4 : 1;

                Mat bottom_blob_packed;
                convert_packing(bottom_blobs[i], bottom_blob_packed, elempack, opt);
                bottom_blobs[i] = bottom_blob_packed;
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     fprintf(stderr, "forward_layer %d %s done\n", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     fprintf(stderr, "[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d\n", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}